

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O2

void __thiscall icu_63::CanonicalIterator::cleanPieces(CanonicalIterator *this)

{
  UnicodeString *pUVar1;
  void *in_RSI;
  long lVar2;
  long lVar3;
  
  if (this->pieces != (UnicodeString **)0x0) {
    for (lVar3 = 0; lVar3 < this->pieces_length; lVar3 = lVar3 + 1) {
      pUVar1 = this->pieces[lVar3];
      if (pUVar1 != (UnicodeString *)0x0) {
        lVar2 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        if (lVar2 != 0) {
          lVar2 = lVar2 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar2));
            lVar2 = lVar2 + -0x40;
          } while (lVar2 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
      }
    }
    uprv_free_63(this->pieces);
    this->pieces = (UnicodeString **)0x0;
    this->pieces_length = 0;
  }
  if (this->pieces_lengths != (int32_t *)0x0) {
    uprv_free_63(this->pieces_lengths);
    this->pieces_lengths = (int32_t *)0x0;
  }
  if (this->current != (int32_t *)0x0) {
    uprv_free_63(this->current);
    this->current = (int32_t *)0x0;
    this->current_length = 0;
  }
  return;
}

Assistant:

void CanonicalIterator::cleanPieces() {
    int32_t i = 0;
    if(pieces != NULL) {
        for(i = 0; i < pieces_length; i++) {
            if(pieces[i] != NULL) {
                delete[] pieces[i];
            }
        }
        uprv_free(pieces);
        pieces = NULL;
        pieces_length = 0;
    }
    if(pieces_lengths != NULL) {
        uprv_free(pieces_lengths);
        pieces_lengths = NULL;
    }
    if(current != NULL) {
        uprv_free(current);
        current = NULL;
        current_length = 0;
    }
}